

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IteratorHelper.cpp
# Opt level: O2

void primesieve::IteratorHelper::next
               (uint64_t *start,uint64_t *stop,uint64_t stopHint,uint64_t *dist)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  uVar1 = 0xffffffffffffffff;
  uVar2 = *stop + 1;
  if (*stop + 1 == 0) {
    uVar2 = uVar1;
  }
  *start = uVar2;
  uVar2 = PrimeGenerator::maxCachedPrime();
  uVar6 = *start;
  if (uVar6 < uVar2) {
    *stop = uVar2;
    *dist = uVar2 - *start;
  }
  else {
    auVar8._8_4_ = (int)(uVar6 >> 0x20);
    auVar8._0_8_ = uVar6;
    auVar8._12_4_ = 0x45300000;
    uVar2 = *dist;
    uVar3 = PrimeGenerator::maxCachedPrime();
    dVar7 = SQRT((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
    uVar5 = (ulong)dVar7;
    uVar5 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
    uVar6 = uVar2 << 2;
    if (uVar2 << 2 <= uVar3 * 4) {
      uVar6 = uVar3 * 4;
    }
    if (uVar6 <= uVar5) {
      uVar6 = uVar5;
    }
    if (0xfffffffffffffff < uVar6) {
      uVar6 = 0x1000000000000000;
    }
    *dist = uVar6;
    uVar2 = uVar6 + *start;
    if (CARRY8(uVar6,*start)) {
      uVar2 = uVar1;
    }
    *stop = uVar2;
    if ((stopHint != 0xffffffffffffffff) && (*start <= stopHint)) {
      uVar4 = anon_unknown.dwarf_1099cc::maxPrimeGap<unsigned_long>(stopHint);
      uVar2 = uVar4 + stopHint;
      if (CARRY8(uVar4,stopHint)) {
        uVar2 = uVar1;
      }
      *stop = uVar2;
    }
  }
  return;
}

Assistant:

void IteratorHelper::next(uint64_t* start,
                          uint64_t* stop,
                          uint64_t stopHint,
                          uint64_t* dist)
{
  *start = checkedAdd(*stop, 1);
  uint64_t maxCachedPrime = PrimeGenerator::maxCachedPrime();

  if (*start < maxCachedPrime)
  {
    // When the stop number <= maxCachedPrime
    // primesieve::iterator uses the primes
    // cache instead of sieving and does not
    // even initialize Erat::init()
    *stop = maxCachedPrime;
    *dist = *stop - *start;
  }
  else
  {
    *dist = getNextDist(*start, *dist);
    *stop = checkedAdd(*start, *dist);

    if (useStopHint(*start, stopHint))
      *stop = checkedAdd(stopHint, maxPrimeGap(stopHint));
  }
}